

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void __thiscall VmFunction::UpdateLiveSets(VmFunction *this,VmModule *module)

{
  SmallArray<VmInstruction_*,_4U> *this_00;
  VmBlock *pVVar1;
  VmInstruction *pVVar2;
  bool bVar3;
  bool bVar4;
  VmBlock **ppVVar5;
  VmInstruction **ppVVar6;
  VmValue **ppVVar7;
  VmBlock *pVVar8;
  uint i;
  uint uVar9;
  SmallArray<VmInstruction_*,_4U> *pSVar10;
  SmallArray<VmBlock_*,_4U> *pSVar11;
  uint k;
  uint uVar12;
  VmInstruction *liveIn;
  VmInstruction *instruction;
  SmallArray<VmBlock_*,_32U> worklist;
  VmBlock *local_178;
  VmInstruction *local_170;
  uint local_164;
  SmallArray<VmBlock_*,_4U> *local_160;
  SmallArray<VmInstruction_*,_4U> *local_158;
  VmBlock *local_150;
  SmallArray<VmBlock_*,_32U> local_148;
  
  local_148.allocator = module->allocator;
  local_148.data = local_148.little;
  local_148.count = 0;
  local_148.max = 0x20;
  ppVVar5 = &this->firstBlock;
  while( true ) {
    local_178 = *ppVVar5;
    if (local_178 == (VmBlock *)0x0) break;
    (local_178->liveIn).count = 0;
    (local_178->liveOut).count = 0;
    SmallArray<VmBlock_*,_32U>::push_back(&local_148,&local_178);
    ppVVar5 = &local_178->nextSibling;
  }
  local_178 = (VmBlock *)0x0;
  do {
    if (local_148.count == 0) {
      SmallArray<VmBlock_*,_32U>::~SmallArray(&local_148);
      return;
    }
    ppVVar5 = SmallArray<VmBlock_*,_32U>::back(&local_148);
    pVVar1 = *ppVVar5;
    SmallArray<VmBlock_*,_32U>::pop_back(&local_148);
    (pVVar1->liveOut).count = 0;
    this_00 = &pVVar1->liveOut;
    local_160 = &pVVar1->successors;
    uVar12 = 0;
    while (uVar12 < (pVVar1->successors).count) {
      local_164 = uVar12;
      ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](local_160,uVar12);
      pVVar8 = *ppVVar5;
      pSVar10 = &pVVar8->liveIn;
      local_158 = pSVar10;
      local_150 = pVVar8;
      for (uVar12 = 0; uVar12 < (pVVar8->liveIn).count; uVar12 = uVar12 + 1) {
        ppVVar6 = SmallArray<VmInstruction_*,_4U>::operator[](pSVar10,uVar12);
        local_178 = (VmBlock *)*ppVVar6;
        if (*(VmInstructionType *)&(local_178->name).begin == VM_INST_PHI) {
          bVar4 = false;
          for (uVar9 = 0; uVar9 < local_178->uniqueId; uVar9 = uVar9 + 2) {
            ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&(local_178->name).end,uVar9);
            local_170 = (VmInstruction *)*ppVVar7;
            if ((local_170 == (VmInstruction *)0x0) || ((local_170->super_VmValue).typeID != 2)) {
              local_170 = (VmInstruction *)0x0;
            }
            ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&(local_178->name).end,uVar9 + 1);
            pVVar8 = (VmBlock *)*ppVVar7;
            if ((pVVar8 == (VmBlock *)0x0) || ((pVVar8->super_VmValue).typeID != 3)) {
              pVVar8 = (VmBlock *)0x0;
            }
            if (pVVar8 == pVVar1) {
              bVar3 = SmallArray<VmInstruction_*,_4U>::contains(this_00,&local_170);
              bVar4 = true;
              if (!bVar3) {
                SmallArray<VmInstruction_*,_4U>::push_back(this_00,&local_170);
              }
            }
          }
          pVVar8 = local_150;
          pSVar10 = local_158;
          if (!bVar4) goto LAB_0019769b;
        }
        else {
LAB_0019769b:
          bVar4 = SmallArray<VmInstruction_*,_4U>::contains(this_00,(VmInstruction **)&local_178);
          if (!bVar4) {
            SmallArray<VmInstruction_*,_4U>::push_back(this_00,(VmInstruction **)&local_178);
          }
        }
      }
      uVar12 = local_164 + 1;
    }
    pSVar10 = &pVVar1->liveIn;
    uVar12 = (pVVar1->liveIn).count;
    (pVVar1->liveIn).count = 0;
    for (uVar9 = 0; uVar9 < (pVVar1->liveOut).count; uVar9 = uVar9 + 1) {
      ppVVar6 = SmallArray<VmInstruction_*,_4U>::operator[](this_00,uVar9);
      if ((*ppVVar6)->parent != pVVar1) {
        ppVVar6 = SmallArray<VmInstruction_*,_4U>::operator[](this_00,uVar9);
        bVar4 = SmallArray<VmInstruction_*,_4U>::contains(pSVar10,ppVVar6);
        if (bVar4) {
          __assert_fail("!curr->liveIn.contains(curr->liveOut[i])",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x957,"void VmFunction::UpdateLiveSets(VmModule *)");
        }
        ppVVar6 = SmallArray<VmInstruction_*,_4U>::operator[](this_00,uVar9);
        SmallArray<VmInstruction_*,_4U>::push_back(pSVar10,ppVVar6);
      }
    }
    pSVar11 = (SmallArray<VmBlock_*,_4U> *)&pVVar1->firstInstruction;
    while( true ) {
      local_178 = (VmBlock *)pSVar11->data;
      if (local_178 == (VmBlock *)0x0) break;
      for (uVar9 = 0; uVar9 < local_178->uniqueId; uVar9 = uVar9 + 1) {
        ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                            ((SmallArray<VmValue_*,_4U> *)&(local_178->name).end,uVar9);
        pVVar2 = (VmInstruction *)*ppVVar7;
        if ((pVVar2 != (VmInstruction *)0x0) && ((pVVar2->super_VmValue).typeID == 2)) {
          local_170 = pVVar2;
          if (*(VmInstructionType *)&(local_178->name).begin == VM_INST_PHI) {
            bVar4 = SmallArray<VmInstruction_*,_4U>::contains(pSVar10,(VmInstruction **)&local_178);
            ppVVar5 = &local_178;
          }
          else {
            if (pVVar2->parent == pVVar1) goto LAB_001977bc;
            bVar4 = SmallArray<VmInstruction_*,_4U>::contains(pSVar10,&local_170);
            ppVVar5 = (VmBlock **)&local_170;
          }
          if (bVar4 == false) {
            SmallArray<VmInstruction_*,_4U>::push_back(pSVar10,(VmInstruction **)ppVVar5);
          }
        }
LAB_001977bc:
      }
      pSVar11 = &local_178->predecessors;
    }
    local_178 = (VmBlock *)0x0;
    if (uVar12 != (pVVar1->liveIn).count) {
      for (uVar12 = 0; uVar12 < (pVVar1->predecessors).count; uVar12 = uVar12 + 1) {
        ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](&pVVar1->predecessors,uVar12);
        local_178 = *ppVVar5;
        bVar4 = SmallArray<VmBlock_*,_32U>::contains(&local_148,&local_178);
        if (!bVar4) {
          SmallArray<VmBlock_*,_32U>::push_back(&local_148,&local_178);
        }
      }
    }
  } while( true );
}

Assistant:

void VmFunction::UpdateLiveSets(VmModule *module)
{
	SmallArray<VmBlock*, 32> worklist(module->allocator);

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		curr->liveIn.clear();
		curr->liveOut.clear();

		worklist.push_back(curr);
	}

	while(!worklist.empty())
	{
		VmBlock *curr = worklist.back();
		worklist.pop_back();

		// Update block liveOut list
		curr->liveOut.clear();

		for(unsigned successorPos = 0; successorPos < curr->successors.size(); successorPos++)
		{
			VmBlock *successor = curr->successors[successorPos];

			for(unsigned k = 0; k < successor->liveIn.size(); k++)
			{
				VmInstruction *liveIn = successor->liveIn[k];

				bool found = false;

				if(liveIn->cmd == VM_INST_PHI)
				{
					for(unsigned argument = 0; argument < liveIn->arguments.size(); argument += 2)
					{
						VmInstruction *instruction = getType<VmInstruction>(liveIn->arguments[argument]);
						VmBlock *edge = getType<VmBlock>(liveIn->arguments[argument + 1]);

						if(edge == curr)
						{
							if(!curr->liveOut.contains(instruction))
								curr->liveOut.push_back(instruction);

							found = true;
						}
					}

					if(!found)
					{
						if(!curr->liveOut.contains(liveIn))
							curr->liveOut.push_back(liveIn);
					}
				}
				else
				{
					if(!curr->liveOut.contains(liveIn))
						curr->liveOut.push_back(liveIn);
				}
			}
		}

		unsigned liveInSize = curr->liveIn.size();

		// Update block liveIn list
		curr->liveIn.clear();

		// Add all liveOut variables that are not defined by current block
		for(unsigned i = 0; i < curr->liveOut.size(); i++)
		{
			if(curr->liveOut[i]->parent != curr)
			{
				assert(!curr->liveIn.contains(curr->liveOut[i]));
				curr->liveIn.push_back(curr->liveOut[i]);
			}
		}

		// Add all arguments from phi isntructions and all arguments that are not defined in current block
		for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
		{
			for(unsigned i = 0; i < inst->arguments.size(); i++)
			{
				if(VmInstruction *argument = getType<VmInstruction>(inst->arguments[i]))
				{
					if(inst->cmd == VM_INST_PHI)
					{
						if(!curr->liveIn.contains(inst))
							curr->liveIn.push_back(inst);
					}
					else
					{
						if(argument->parent != curr)
						{
							if(!curr->liveIn.contains(argument))
								curr->liveIn.push_back(argument);
						}
					}
				}
			}
		}

		if(liveInSize != curr->liveIn.size())
		{
			for(unsigned i = 0; i < curr->predecessors.size(); i++)
			{
				VmBlock *predecessor = curr->predecessors[i];

				if(!worklist.contains(predecessor))
					worklist.push_back(predecessor);
			}
		}
	}
}